

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# static_dict.cpp
# Opt level: O1

int duckdb_brotli::BrotliFindAllStaticDictionaryMatches
              (BrotliEncoderDictionary *dictionary,uint8_t *data,size_t min_length,size_t max_length
              ,uint32_t *matches)

{
  ContextualEncoderDictionary *pCVar1;
  uint uVar2;
  uint uVar3;
  long lVar4;
  uint uVar5;
  BrotliEncoderDictionary *dictionary_00;
  undefined1 auVar6 [16];
  undefined1 auVar8 [16];
  uint32_t matches2 [38];
  undefined4 uStack_d4;
  undefined8 uStack_d0;
  uint32_t local_c8 [38];
  long lVar7;
  
  uStack_d0 = 0x1c53ce9;
  uVar2 = BrotliFindAllStaticDictionaryMatchesFor(dictionary,data,min_length,max_length,matches);
  pCVar1 = dictionary->parent;
  if ((pCVar1 != (ContextualEncoderDictionary *)0x0) && (1 < pCVar1->num_dictionaries)) {
    dictionary_00 = pCVar1->dict[0];
    if (dictionary_00 == dictionary) {
      dictionary_00 = pCVar1->dict[1];
    }
    lVar4 = 3;
    auVar6 = _DAT_01df1090;
    auVar8 = _DAT_01df1070;
    do {
      if (SUB164(auVar8 ^ _DAT_01de8e80,4) == -0x80000000 &&
          SUB164(auVar8 ^ _DAT_01de8e80,0) < -0x7fffffda) {
        (&uStack_d4)[lVar4] = 0xfffffff;
        local_c8[lVar4 + -2] = 0xfffffff;
      }
      if (SUB164(auVar6 ^ _DAT_01de8e80,4) == -0x80000000 &&
          SUB164(auVar6 ^ _DAT_01de8e80,0) < -0x7fffffda) {
        local_c8[lVar4 + -1] = 0xfffffff;
        local_c8[lVar4] = 0xfffffff;
      }
      lVar7 = auVar8._8_8_;
      auVar8._0_8_ = auVar8._0_8_ + 4;
      auVar8._8_8_ = lVar7 + 4;
      lVar7 = auVar6._8_8_;
      auVar6._0_8_ = auVar6._0_8_ + 4;
      auVar6._8_8_ = lVar7 + 4;
      lVar4 = lVar4 + 4;
    } while (lVar4 != 0x2b);
    uStack_d0 = 0x1c53de8;
    uVar3 = BrotliFindAllStaticDictionaryMatchesFor
                      (dictionary_00,data,min_length,max_length,local_c8);
    lVar4 = 0;
    do {
      uVar5 = local_c8[lVar4];
      if (uVar5 != 0xfffffff) {
        uVar5 = (1 << (dictionary->words->size_bits_by_length[uVar5 & 0x1f] & 0x1f) & 0x7fffffeU) *
                dictionary->num_transforms * 0x20 + uVar5;
        if (matches[lVar4] < uVar5) {
          uVar5 = matches[lVar4];
        }
        matches[lVar4] = uVar5;
      }
      lVar4 = lVar4 + 1;
    } while (lVar4 != 0x26);
    uVar2 = uVar2 | uVar3;
  }
  return uVar2;
}

Assistant:

BROTLI_BOOL duckdb_brotli::BrotliFindAllStaticDictionaryMatches(
    const BrotliEncoderDictionary* dictionary, const uint8_t* data,
    size_t min_length, size_t max_length, uint32_t* matches) {
  BROTLI_BOOL has_found_match =
      BrotliFindAllStaticDictionaryMatchesFor(
          dictionary, data, min_length, max_length, matches);

  if (!!dictionary->parent && dictionary->parent->num_dictionaries > 1) {
    uint32_t matches2[BROTLI_MAX_STATIC_DICTIONARY_MATCH_LEN + 1];
    int l;
    const BrotliEncoderDictionary* dictionary2 = dictionary->parent->dict[0];
    if (dictionary2 == dictionary) {
      dictionary2 = dictionary->parent->dict[1];
    }

    for (l = 0; l < BROTLI_MAX_STATIC_DICTIONARY_MATCH_LEN + 1; l++) {
      matches2[l] = kInvalidMatch;
    }

    has_found_match |= BrotliFindAllStaticDictionaryMatchesFor(
        dictionary2, data, min_length, max_length, matches2);

    for (l = 0; l < BROTLI_MAX_STATIC_DICTIONARY_MATCH_LEN + 1; l++) {
      if (matches2[l] != kInvalidMatch) {
        uint32_t dist = (uint32_t)(matches2[l] >> 5);
        uint32_t len_code = matches2[l] & 31;
        uint32_t skipdist = (uint32_t)((uint32_t)(1 << dictionary->words->
            size_bits_by_length[len_code]) & ~1u) *
            (uint32_t)dictionary->num_transforms;
        /* TODO(lode): check for dist overflow */
        dist += skipdist;
        AddMatch(dist, (size_t)l, len_code, matches);
      }
    }
  }
  return has_found_match;
}